

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtesteventloop.cpp
# Opt level: O1

void QTestEventLoop::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  long lVar2;
  long in_FS_OFFSET;
  void *local_38;
  char *pcStack_30;
  QMetaTypeInterface *local_28 [2];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == InvokeMetaMethod && _id == 0) {
    lVar1 = QObject::thread();
    lVar2 = QThread::currentThread();
    if (lVar1 == lVar2) {
      QBasicTimer::stop();
      if (*(long *)(_o + 0x10) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
          QEventLoop::exit((int)*(long *)(_o + 0x10));
          return;
        }
        goto LAB_0011a680;
      }
    }
    else {
      local_38 = (void *)0x0;
      pcStack_30 = (char *)0x0;
      local_28[0] = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl(_o,"exitLoop",QueuedConnection,1,&local_38,&pcStack_30,local_28)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
LAB_0011a680:
  __stack_chk_fail();
}

Assistant:

void QTestEventLoop::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTestEventLoop *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->exitLoop(); break;
        default: ;
        }
    }
    (void)_a;
}